

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pop3.c
# Opt level: O1

CURLcode pop3_statemach_act(connectdata *conn)

{
  byte *pbVar1;
  uint *puVar2;
  curl_usessl cVar3;
  int *piVar4;
  _Bool _Var5;
  CURLcode CVar6;
  uint uVar7;
  size_t sVar8;
  ulong uVar9;
  ulong maxlen;
  char *pcVar10;
  SessionHandle *pSVar11;
  char *pcVar12;
  curl_socket_t sockfd;
  long lVar13;
  pingpong *pp;
  bool bVar14;
  int pop3code;
  pop3_conn *pop3c;
  size_t nread;
  uint local_58;
  curl_socket_t local_54;
  pingpong *local_50;
  saslprogress local_48;
  undefined4 uStack_44;
  SASL *local_40;
  size_t local_38;
  
  sockfd = conn->sock[0];
  local_38 = 0;
  CVar6 = CURLE_NOT_BUILT_IN;
  if ((conn->proto).imapc.state != IMAP_UPGRADETLS) {
    pp = (pingpong *)&conn->proto;
    if ((conn->proto).ftpc.pp.sendleft != 0) {
      CVar6 = Curl_pp_flushsend(pp);
      return CVar6;
    }
    local_40 = (SASL *)&(conn->proto).imapc.sasl.prefmech;
    local_50 = pp;
    do {
      CVar6 = Curl_pp_readresp(sockfd,pp,(int *)&local_58,&local_38);
      uVar7 = local_58;
      if (CVar6 != CURLE_OK) {
        return CVar6;
      }
      if (local_58 == 0) {
        return CURLE_OK;
      }
      switch((conn->proto).imapc.state) {
      case IMAP_SERVERGREET:
        pSVar11 = conn->data;
        sVar8 = strlen((pSVar11->state).buffer);
        if (uVar7 == 0x2b) {
          if (((3 < sVar8) && (3 < sVar8 - 2)) && ((pSVar11->state).buffer[sVar8 - 2] == '>')) {
            pcVar10 = (pSVar11->state).buffer + 3;
            do {
              if (*pcVar10 == '<') {
                if (sVar8 != 4) {
                  pcVar12 = (char *)(*Curl_ccalloc)(1,sVar8 - 3);
                  (conn->proto).imapc.mailbox_uidvalidity = pcVar12;
                  if (pcVar12 != (char *)0x0) {
                    memcpy(pcVar12,pcVar10,sVar8 - 4);
                    (conn->proto).imapc.mailbox_uidvalidity[sVar8 - 4] = '\0';
                    pbVar1 = (byte *)((long)&conn->proto + 0xa8);
                    *pbVar1 = *pbVar1 | 2;
                  }
                }
                break;
              }
              pcVar10 = pcVar10 + 1;
              sVar8 = sVar8 - 1;
            } while (sVar8 != 5);
          }
          pp = local_50;
          *(undefined4 *)((long)&conn->proto + 0x94) = 0;
          (conn->proto).imapc.cmdid = 0;
          (conn->proto).pop3c.tls_supported = false;
          CVar6 = Curl_pp_sendf(local_50,"%s","CAPA");
          if (CVar6 == CURLE_OK) {
            (conn->proto).imapc.state = IMAP_CAPABILITY;
          }
        }
        else {
          Curl_failf(pSVar11,"Got unexpected pop3-server response");
          pp = local_50;
          CVar6 = CURLE_FTP_WEIRD_SERVER_REPLY;
        }
        break;
      case IMAP_CAPABILITY:
        pSVar11 = conn->data;
        pcVar10 = (pSVar11->state).buffer;
        local_54 = sockfd;
        sVar8 = strlen(pcVar10);
        pp = local_50;
        sockfd = local_54;
        if (uVar7 == 0x2b) {
          cVar3 = (pSVar11->set).use_ssl;
          if ((cVar3 == CURLUSESSL_NONE) || (conn->ssl[0].use != false)) {
LAB_00581918:
            CVar6 = pop3_perform_authentication(conn);
          }
          else if ((conn->proto).pop3c.tls_supported == true) {
            CVar6 = Curl_pp_sendf(local_50,"%s","STLS");
            if (CVar6 == CURLE_OK) {
              (conn->proto).imapc.state = IMAP_STARTTLS;
            }
          }
          else {
            if (cVar3 == CURLUSESSL_TRY) goto LAB_00581918;
            Curl_failf(pSVar11,"STLS not supported.");
            CVar6 = CURLE_USE_SSL_FAILED;
          }
        }
        else if (uVar7 == 0x2a) {
          if (sVar8 < 4) {
LAB_00581650:
            CVar6 = CURLE_OK;
            if ((4 < sVar8) && ((pSVar11->state).buffer[4] == ' ' && *(int *)pcVar10 == 0x4c534153))
            {
              pbVar1 = (byte *)((long)&conn->proto + 0xa8);
              *pbVar1 = *pbVar1 | 4;
              lVar13 = sVar8 - 5;
              pcVar10 = (pSVar11->state).buffer + 5;
LAB_00581689:
              bVar14 = lVar13 == 0;
              pcVar12 = pcVar10;
              if (!bVar14) {
                pcVar12 = pcVar10 + lVar13;
                lVar13 = -lVar13;
                bVar14 = false;
                do {
                  if ((0x20 < (ulong)(byte)*pcVar10) ||
                     ((0x100002600U >> ((ulong)(byte)*pcVar10 & 0x3f) & 1) == 0)) {
                    uVar9 = 0;
                    goto LAB_005816dc;
                  }
                  pcVar10 = pcVar10 + 1;
                  lVar13 = lVar13 + 1;
                  bVar14 = lVar13 == 0;
                } while (!bVar14);
              }
              lVar13 = 0;
              goto LAB_005816c9;
            }
          }
          else {
            if (*(int *)pcVar10 == 0x534c5453) {
              (conn->proto).pop3c.tls_supported = true;
            }
            else {
              if (*(int *)pcVar10 != 0x52455355) goto LAB_00581650;
              pbVar1 = (byte *)((long)&conn->proto + 0xa8);
              *pbVar1 = *pbVar1 | 1;
            }
            CVar6 = CURLE_OK;
          }
        }
        else {
          pbVar1 = (byte *)((long)&conn->proto + 0xa8);
          *pbVar1 = *pbVar1 | 1;
          CVar6 = pop3_perform_authentication(conn);
          pp = local_50;
          sockfd = local_54;
        }
        break;
      case IMAP_STARTTLS:
        CVar6 = CURLE_NOT_BUILT_IN;
        if (local_58 != 0x2b) {
          if ((conn->data->set).use_ssl == CURLUSESSL_TRY) {
            CVar6 = pop3_perform_authentication(conn);
          }
          else {
            Curl_failf(conn->data,"STARTTLS denied. %c",(ulong)local_58);
            CVar6 = CURLE_USE_SSL_FAILED;
          }
        }
        break;
      case IMAP_AUTHENTICATE:
        pSVar11 = conn->data;
        CVar6 = Curl_sasl_continue(local_40,conn,local_58,&local_48);
        if (CVar6 == CURLE_OK) {
          if (local_48 == SASL_IDLE) {
            uVar7 = (conn->proto).pop3c.preftype & (conn->proto).pop3c.authtypes;
            if ((uVar7 & 2) == 0) {
              if ((uVar7 & 1) == 0) {
                Curl_failf(pSVar11,"Authentication cancelled");
                CVar6 = CURLE_LOGIN_DENIED;
              }
              else {
                CVar6 = pop3_perform_user(conn);
              }
            }
            else {
              CVar6 = pop3_perform_apop(conn);
            }
          }
          else {
            CVar6 = CURLE_OK;
            if (local_48 == SASL_DONE) {
              (conn->proto).imapc.state = IMAP_STOP;
              CVar6 = CURLE_OK;
            }
          }
        }
        break;
      case IMAP_LOGIN:
        if (local_58 == 0x2b) goto switchD_00581565_caseD_4;
        pSVar11 = conn->data;
        pcVar10 = "Authentication failed: %d";
LAB_005818e5:
        Curl_failf(pSVar11,pcVar10,(ulong)local_58);
        CVar6 = CURLE_LOGIN_DENIED;
        break;
      case IMAP_LIST:
        if (local_58 == 0x2b) {
          pcVar10 = conn->passwd;
          if (pcVar10 == (char *)0x0) {
            pcVar10 = "";
          }
          CVar6 = Curl_pp_sendf(pp,"PASS %s",pcVar10);
        }
        else {
          Curl_failf(conn->data,"Access denied. %c",(ulong)local_58);
          CVar6 = CURLE_LOGIN_DENIED;
        }
        if (CVar6 == CURLE_OK) {
          (conn->proto).imapc.state = IMAP_SELECT;
        }
        break;
      case IMAP_SELECT:
        if (local_58 != 0x2b) {
          pSVar11 = conn->data;
          pcVar10 = "Access denied. %c";
          goto LAB_005818e5;
        }
      default:
switchD_00581565_caseD_4:
        (conn->proto).imapc.state = IMAP_STOP;
        CVar6 = CURLE_OK;
        break;
      case IMAP_FETCH:
        if (local_58 == 0x2b) {
          pSVar11 = conn->data;
          piVar4 = (int *)(pSVar11->req).protop;
          (conn->proto).pop3c.eob = 2;
          (conn->proto).pop3c.strip = 2;
          if (*piVar4 == 0) {
            Curl_setup_transfer(conn,0,-1,false,(curl_off_t *)0x0,-1,(curl_off_t *)0x0);
            pp = local_50;
            pcVar10 = (conn->proto).ftpc.pp.cache;
            if (pcVar10 != (char *)0x0) {
              if (((pSVar11->set).opt_no_body == false) &&
                 (CVar6 = Curl_pop3_write(conn,pcVar10,(conn->proto).rtspc.rtp_bufsize),
                 CVar6 != CURLE_OK)) break;
              (*Curl_cfree)(((pingpong *)&pp->cache)->cache);
              ((pingpong *)&pp->cache)->cache = (char *)0x0;
              pp->cache_size = 0;
            }
          }
          (conn->proto).imapc.state = IMAP_STOP;
          pp = local_50;
          CVar6 = CURLE_OK;
        }
        else {
          (conn->proto).imapc.state = IMAP_STOP;
          CVar6 = CURLE_RECV_ERROR;
        }
      }
LAB_00581aba:
      if (CVar6 != CURLE_OK) {
        return CVar6;
      }
      if ((conn->proto).imapc.state == IMAP_STOP) {
        return CURLE_OK;
      }
      _Var5 = Curl_pp_moredata(pp);
      CVar6 = CURLE_OK;
    } while (_Var5);
  }
  return CVar6;
  while (uVar9 = uVar9 + 1, maxlen = -lVar13, uVar9 < (ulong)-lVar13) {
LAB_005816dc:
    if (((ulong)(byte)pcVar10[uVar9] < 0x21) &&
       (maxlen = uVar9, (0x100002600U >> ((ulong)(byte)pcVar10[uVar9] & 0x3f) & 1) != 0)) break;
  }
  uVar7 = Curl_sasl_decode_mech(pcVar10,maxlen,(size_t *)&local_48);
  if ((uVar7 != 0) && (CONCAT44(uStack_44,local_48) == maxlen)) {
    puVar2 = (uint *)((long)&conn->proto + 0x94);
    *puVar2 = *puVar2 | uVar7;
  }
  pcVar12 = pcVar10 + maxlen;
  lVar13 = -(lVar13 + maxlen);
LAB_005816c9:
  pcVar10 = pcVar12;
  pp = local_50;
  sockfd = local_54;
  CVar6 = CURLE_OK;
  if (bVar14) goto LAB_00581aba;
  goto LAB_00581689;
}

Assistant:

static CURLcode pop3_statemach_act(struct connectdata *conn)
{
  CURLcode result = CURLE_OK;
  curl_socket_t sock = conn->sock[FIRSTSOCKET];
  int pop3code;
  struct pop3_conn *pop3c = &conn->proto.pop3c;
  struct pingpong *pp = &pop3c->pp;
  size_t nread = 0;

  /* Busy upgrading the connection; right now all I/O is SSL/TLS, not POP3 */
  if(pop3c->state == POP3_UPGRADETLS)
    return pop3_perform_upgrade_tls(conn);

  /* Flush any data that needs to be sent */
  if(pp->sendleft)
    return Curl_pp_flushsend(pp);

 do {
    /* Read the response from the server */
    result = Curl_pp_readresp(sock, pp, &pop3code, &nread);
    if(result)
      return result;

    if(!pop3code)
      break;

    /* We have now received a full POP3 server response */
    switch(pop3c->state) {
    case POP3_SERVERGREET:
      result = pop3_state_servergreet_resp(conn, pop3code, pop3c->state);
      break;

    case POP3_CAPA:
      result = pop3_state_capa_resp(conn, pop3code, pop3c->state);
      break;

    case POP3_STARTTLS:
      result = pop3_state_starttls_resp(conn, pop3code, pop3c->state);
      break;

    case POP3_AUTH:
      result = pop3_state_auth_resp(conn, pop3code, pop3c->state);
      break;

#ifndef CURL_DISABLE_CRYPTO_AUTH
    case POP3_APOP:
      result = pop3_state_apop_resp(conn, pop3code, pop3c->state);
      break;
#endif

    case POP3_USER:
      result = pop3_state_user_resp(conn, pop3code, pop3c->state);
      break;

    case POP3_PASS:
      result = pop3_state_pass_resp(conn, pop3code, pop3c->state);
      break;

    case POP3_COMMAND:
      result = pop3_state_command_resp(conn, pop3code, pop3c->state);
      break;

    case POP3_QUIT:
      /* fallthrough, just stop! */
    default:
      /* internal error */
      state(conn, POP3_STOP);
      break;
    }
  } while(!result && pop3c->state != POP3_STOP && Curl_pp_moredata(pp));

  return result;
}